

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu_helper.cpp
# Opt level: O2

NametableCell __thiscall
nesvis::PpuHelper::get_nametable_cell(PpuHelper *this,int x,int y,uint16_t nametable)

{
  uint uVar1;
  IMmu *pIVar2;
  uint uVar3;
  
  uVar3 = (uint)nametable * 0x400 + y * 0x20 + x + 0x2000;
  pIVar2 = n_e_s::nes::Nes::ppu_mmu(this->nes_);
  uVar1 = (*pIVar2->_vptr_IMmu[3])(pIVar2,(ulong)(uVar3 & 0xffff));
  return (NametableCell)(uVar1 & 0xff | uVar3 * 0x10000);
}

Assistant:

PpuHelper::NametableCell PpuHelper::get_nametable_cell(int x,
        int y,
        uint16_t nametable) {
    // $2000-$23FF   $0400 Nametable 0
    // $2400-$27FF   $0400 Nametable 1
    // $2800-$2BFF   $0400 Nametable 2
    // $2C00-$2FFF   $0400 Nametable 3
    // $3000-$3EFF   $0F00 Mirrors of $2000-$2EFF
    const uint16_t address = 0x2000 + 0x0400 * nametable + y * 32 + x;
    const uint8_t tile_index = nes_->ppu_mmu().read_byte(address);

    return {.tile_index = tile_index, .address = address};
}